

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTools.hpp
# Opt level: O1

string * CLI::detail::sum_string_vector
                   (string *__return_storage_ptr__,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *values)

{
  pointer pbVar1;
  pointer pcVar2;
  bool bVar3;
  int *piVar4;
  int64_t iVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_1;
  pointer pbVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg;
  bool bVar7;
  double tv;
  double local_200;
  string local_1e8;
  undefined1 *local_1c8 [2];
  undefined1 local_1b8 [16];
  double local_1a8;
  undefined8 local_1a0 [13];
  ios_base local_138 [264];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pbVar6 = (values->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (values->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar6 == pbVar1) {
    local_200 = 0.0;
    bVar7 = false;
  }
  else {
    local_200 = 0.0;
    bVar7 = false;
    do {
      local_1a8 = 0.0;
      bVar3 = lexical_cast<double,_(CLI::detail::enabler)0>(pbVar6,&local_1a8);
      if (bVar3) {
LAB_00115d3a:
        local_200 = local_200 + local_1a8;
        bVar3 = false;
      }
      else {
        piVar4 = __errno_location();
        *piVar4 = 0;
        pcVar2 = (pbVar6->_M_dataplus)._M_p;
        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1e8,pcVar2,pcVar2 + pbVar6->_M_string_length);
        iVar5 = to_flag_value(&local_1e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p);
        }
        bVar3 = true;
        bVar7 = *piVar4 != 0;
        if (!bVar7) {
          local_1a8 = (double)iVar5;
          goto LAB_00115d3a;
        }
      }
    } while ((!bVar3) && (pbVar6 = pbVar6 + 1, pbVar6 != pbVar1));
  }
  if (bVar7) {
    pbVar1 = (values->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar6 = (values->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar1; pbVar6 = pbVar6 + 1)
    {
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)(pbVar6->_M_dataplus)._M_p);
    }
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    *(undefined8 *)((long)local_1a0 + *(long *)((long)local_1a8 + -0x18)) = 0x10;
    ::std::ostream::_M_insert<double>(local_200);
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_1c8);
    if (local_1c8[0] != local_1b8) {
      operator_delete(local_1c8[0]);
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    ::std::ios_base::~ios_base(local_138);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string sum_string_vector(const std::vector<std::string> &values) {
    double val{0.0};
    bool fail{false};
    std::string output;
    for(const auto &arg : values) {
        double tv{0.0};
        auto comp = lexical_cast(arg, tv);
        if(!comp) {
            errno = 0;
            auto fv = detail::to_flag_value(arg);
            fail = (errno != 0);
            if(fail) {
                break;
            }
            tv = static_cast<double>(fv);
        }
        val += tv;
    }
    if(fail) {
        for(const auto &arg : values) {
            output.append(arg);
        }
    } else {
        std::ostringstream out;
        out.precision(16);
        out << val;
        output = out.str();
    }
    return output;
}